

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

int mcpl2ssw_app(int argc,char **argv)

{
  int iVar1;
  undefined4 in_EDI;
  char **unaff_retaddr;
  char **in_stack_00000008;
  int parse;
  long surface_id;
  long nparticles_limit;
  char *outsswfile;
  char *refsswfile;
  char *inmcplfile;
  long in_stack_00000110;
  long in_stack_00000118;
  char *in_stack_00000120;
  char *in_stack_00000128;
  char *in_stack_00000130;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mcpl2ssw_parse_args((int)outsswfile,(char **)nparticles_limit,(char **)surface_id,
                              in_stack_00000008,unaff_retaddr,
                              (long *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),(long *)inmcplfile)
  ;
  if (iVar1 == -1) {
    iVar1 = 0;
  }
  else if (iVar1 == 0) {
    iVar1 = mcpl2ssw(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
                     in_stack_00000110);
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mcpl2ssw_app( int argc, char** argv ) {

  const char * inmcplfile;
  const char * refsswfile;
  const char * outsswfile;
  long nparticles_limit;
  long surface_id;

  int parse = mcpl2ssw_parse_args( argc, (const char**)argv,
                                   &inmcplfile, &refsswfile, &outsswfile,
                                   &nparticles_limit, &surface_id );

  if (parse==-1)// --help
    return 0;

  if (parse)// parse error
    return parse;

  if (mcpl2ssw(inmcplfile, outsswfile, refsswfile,surface_id, nparticles_limit))
    return 0;

  return 1;

}